

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts3SegReaderNextDocid
              (Fts3Table *pTab,Fts3SegReader *pReader,char **ppOffsetList,int *pnOffsetList)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  byte bVar9;
  u8 bEof;
  char *local_48;
  sqlite_int64 local_40;
  Fts3Table *local_38;
  
  pcVar6 = pReader->pOffsetList;
  local_48 = pcVar6;
  if ((pTab->bDescIdx != '\0') && (pReader->ppNextElem != (Fts3HashElem **)0x0)) {
    local_40._0_1_ = '\0';
    if (ppOffsetList != (char **)0x0) {
      *ppOffsetList = pcVar6;
      *pnOffsetList = pReader->nOffsetList + -1;
    }
    sqlite3Fts3DoclistPrev
              (0,pReader->aDoclist,pReader->nDoclist,&local_48,&pReader->iDocid,
               &pReader->nOffsetList,(u8 *)&local_40);
    pcVar6 = (char *)0x0;
    if ((u8)local_40 == '\0') {
      pcVar6 = local_48;
    }
    pReader->pOffsetList = pcVar6;
    return 0;
  }
  pcVar8 = pReader->aDoclist + pReader->nDoclist;
  bVar9 = 0;
  pcVar7 = pcVar6;
  local_38 = pTab;
  do {
    for (pcVar6 = (char *)CONCAT71((int7)((ulong)pcVar6 >> 8),*pcVar7);
        (byte)pcVar6 != 0 || bVar9 != 0;
        pcVar6 = (char *)CONCAT71((int7)((ulong)pcVar6 >> 8),*pcVar1)) {
      bVar9 = (byte)pcVar6 & 0x80;
      pcVar1 = pcVar7 + 1;
      pcVar7 = pcVar7 + 1;
    }
    if ((pReader->pBlob == (sqlite3_blob *)0x0) ||
       (pcVar6 = pReader->aNode + pReader->nPopulate, pcVar7 < pcVar6)) {
      pcVar7 = pcVar7 + 1;
      if (ppOffsetList != (char **)0x0) {
        *ppOffsetList = pReader->pOffsetList;
        pcVar6 = (char *)(ulong)~*(uint *)&pReader->pOffsetList;
        *pnOffsetList = (int)pcVar7 + ~*(uint *)&pReader->pOffsetList;
      }
      pcVar6 = (char *)CONCAT71((int7)((ulong)pcVar6 >> 8),pcVar7 < pcVar8);
      if (pcVar7 >= pcVar8) goto LAB_001cb527;
      cVar2 = *pcVar7;
      goto joined_r0x001cb4a6;
    }
    uVar4 = fts3SegReaderIncrRead(pReader);
    pcVar6 = (char *)(ulong)uVar4;
  } while (uVar4 == 0);
  bVar3 = false;
  goto LAB_001cb532;
joined_r0x001cb4a6:
  if (cVar2 != '\0') goto LAB_001cb4c6;
  pcVar7 = pcVar7 + 1;
  pcVar6 = (char *)CONCAT71((int7)((ulong)pcVar6 >> 8),pcVar7 < pcVar8);
  if (pcVar7 >= pcVar8) goto LAB_001cb527;
  cVar2 = *pcVar7;
  goto joined_r0x001cb4a6;
LAB_001cb4c6:
  if ((char)pcVar6 == '\0') {
LAB_001cb527:
    pReader->pOffsetList = (char *)0x0;
    bVar3 = true;
  }
  else {
    local_48 = pcVar7;
    uVar4 = fts3SegReaderRequire(pReader,pcVar7,10);
    pcVar6 = (char *)(ulong)uVar4;
    bVar3 = true;
    if (uVar4 == 0) {
      iVar5 = sqlite3Fts3GetVarint(pcVar7,&local_40);
      pReader->pOffsetList = pcVar7 + iVar5;
      pcVar6 = (char *)CONCAT71(local_40._1_7_,(u8)local_40);
      pcVar7 = (char *)-(long)pcVar6;
      if (local_38->bDescIdx == '\0') {
        pcVar7 = pcVar6;
      }
      pReader->iDocid = (sqlite3_int64)(pcVar7 + pReader->iDocid);
    }
  }
LAB_001cb532:
  if (bVar3) {
    return 0;
  }
  return (int)pcVar6;
}

Assistant:

static int fts3SegReaderNextDocid(
  Fts3Table *pTab,
  Fts3SegReader *pReader,         /* Reader to advance to next docid */
  char **ppOffsetList,            /* OUT: Pointer to current position-list */
  int *pnOffsetList               /* OUT: Length of *ppOffsetList in bytes */
){
  int rc = SQLITE_OK;
  char *p = pReader->pOffsetList;
  char c = 0;

  assert( p );

  if( pTab->bDescIdx && fts3SegReaderIsPending(pReader) ){
    /* A pending-terms seg-reader for an FTS4 table that uses order=desc.
    ** Pending-terms doclists are always built up in ascending order, so
    ** we have to iterate through them backwards here. */
    u8 bEof = 0;
    if( ppOffsetList ){
      *ppOffsetList = pReader->pOffsetList;
      *pnOffsetList = pReader->nOffsetList - 1;
    }
    sqlite3Fts3DoclistPrev(0,
        pReader->aDoclist, pReader->nDoclist, &p, &pReader->iDocid,
        &pReader->nOffsetList, &bEof
    );
    if( bEof ){
      pReader->pOffsetList = 0;
    }else{
      pReader->pOffsetList = p;
    }
  }else{
    char *pEnd = &pReader->aDoclist[pReader->nDoclist];

    /* Pointer p currently points at the first byte of an offset list. The
    ** following block advances it to point one byte past the end of
    ** the same offset list. */
    while( 1 ){
  
      /* The following line of code (and the "p++" below the while() loop) is
      ** normally all that is required to move pointer p to the desired 
      ** position. The exception is if this node is being loaded from disk
      ** incrementally and pointer "p" now points to the first byte past
      ** the populated part of pReader->aNode[].
      */
      while( *p | c ) c = *p++ & 0x80;
      assert( *p==0 );
  
      if( pReader->pBlob==0 || p<&pReader->aNode[pReader->nPopulate] ) break;
      rc = fts3SegReaderIncrRead(pReader);
      if( rc!=SQLITE_OK ) return rc;
    }
    p++;
  
    /* If required, populate the output variables with a pointer to and the
    ** size of the previous offset-list.
    */
    if( ppOffsetList ){
      *ppOffsetList = pReader->pOffsetList;
      *pnOffsetList = (int)(p - pReader->pOffsetList - 1);
    }

    /* List may have been edited in place by fts3EvalNearTrim() */
    while( p<pEnd && *p==0 ) p++;
  
    /* If there are no more entries in the doclist, set pOffsetList to
    ** NULL. Otherwise, set Fts3SegReader.iDocid to the next docid and
    ** Fts3SegReader.pOffsetList to point to the next offset list before
    ** returning.
    */
    if( p>=pEnd ){
      pReader->pOffsetList = 0;
    }else{
      rc = fts3SegReaderRequire(pReader, p, FTS3_VARINT_MAX);
      if( rc==SQLITE_OK ){
        sqlite3_int64 iDelta;
        pReader->pOffsetList = p + sqlite3Fts3GetVarint(p, &iDelta);
        if( pTab->bDescIdx ){
          pReader->iDocid -= iDelta;
        }else{
          pReader->iDocid += iDelta;
        }
      }
    }
  }

  return SQLITE_OK;
}